

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  ushort uVar1;
  uint uVar2;
  void *pvVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  WirePointer *pWVar6;
  StructPointerCount SVar7;
  undefined2 uVar8;
  int iVar9;
  uint uVar10;
  PointerType PVar11;
  int iVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ArrayPtr<const_char> AVar18;
  Fault f;
  StructReader local_b8;
  SegmentReader *local_80;
  WirePointer *local_78;
  CapTableReader *local_70;
  Reader *local_68;
  Reader *local_60;
  PointerReader local_58;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  uVar14 = 0;
  uVar15 = 0;
  uVar16 = 0;
  uVar17 = 0;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  bVar13 = (decl->_reader).pointerCount == 0;
  local_58.pointer = (decl->_reader).pointers;
  if (bVar13) {
    local_58.pointer = (WirePointer *)0x0;
  }
  iVar12 = 0x7fffffff;
  local_58.nestingLimit = (decl->_reader).nestingLimit;
  if (bVar13) {
    local_58.nestingLimit = 0x7fffffff;
  }
  else {
    uVar14 = *(undefined4 *)&(decl->_reader).segment;
    uVar15 = *(undefined4 *)((long)&(decl->_reader).segment + 4);
    uVar16 = *(undefined4 *)&(decl->_reader).capTable;
    uVar17 = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
  }
  local_58.segment = (SegmentReader *)CONCAT44(uVar15,uVar14);
  local_58.capTable = (CapTableReader *)CONCAT44(uVar17,uVar16);
  capnp::_::PointerReader::getStruct(&local_b8,&local_58,(word *)0x0);
  local_58.pointer = (WirePointer *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  if (local_b8.pointerCount != 0) {
    local_58.pointer = (WirePointer *)CONCAT44(local_b8.pointers._4_4_,(int)local_b8.pointers);
    local_58.nestingLimit = local_b8.nestingLimit;
  }
  uVar14 = 0;
  uVar15 = 0;
  uVar16 = 0;
  uVar17 = 0;
  if (local_b8.pointerCount != 0) {
    uVar14 = local_b8.segment._0_4_;
    uVar15 = local_b8.segment._4_4_;
    uVar16 = local_b8.capTable._0_4_;
    uVar17 = local_b8.capTable._4_4_;
  }
  local_58.segment = (SegmentReader *)CONCAT44(uVar15,uVar14);
  local_58.capTable = (CapTableReader *)CONCAT44(uVar17,uVar16);
  AVar18 = (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
  (this->name).content = AVar18;
  pSVar4 = (decl->_reader).segment;
  pCVar5 = (decl->_reader).capTable;
  pvVar3 = (decl->_reader).data;
  pWVar6 = (decl->_reader).pointers;
  SVar7 = (decl->_reader).pointerCount;
  uVar8 = *(undefined2 *)&(decl->_reader).field_0x26;
  iVar9 = (decl->_reader).nestingLimit;
  uVar14 = *(undefined4 *)&(decl->_reader).field_0x2c;
  (this->declId)._reader.dataSize = (decl->_reader).dataSize;
  (this->declId)._reader.pointerCount = SVar7;
  *(undefined2 *)&(this->declId)._reader.field_0x26 = uVar8;
  (this->declId)._reader.nestingLimit = iVar9;
  *(undefined4 *)&(this->declId)._reader.field_0x2c = uVar14;
  (this->declId)._reader.data = pvVar3;
  (this->declId)._reader.pointers = pWVar6;
  (this->declId)._reader.segment = pSVar4;
  (this->declId)._reader.capTable = pCVar5;
  this->declKind = FIELD;
  this->isParam = false;
  this->hasDefaultValue = false;
  local_60 = &this->fieldType;
  uVar14 = 0;
  uVar15 = 0;
  uVar16 = 0;
  uVar17 = 0;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  local_68 = &this->fieldDefaultValue;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  local_b8.data = (WirePointer *)0x0;
  if (3 < (decl->_reader).pointerCount) {
    iVar12 = (decl->_reader).nestingLimit;
    uVar14 = *(undefined4 *)&(decl->_reader).segment;
    uVar15 = *(undefined4 *)((long)&(decl->_reader).segment + 4);
    uVar16 = *(undefined4 *)&(decl->_reader).capTable;
    uVar17 = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
    local_b8.data = (decl->_reader).pointers + 3;
  }
  local_b8.segment = (SegmentReader *)CONCAT44(uVar15,uVar14);
  local_b8.capTable = (CapTableReader *)CONCAT44(uVar17,uVar16);
  local_b8.pointers._0_4_ = iVar12;
  capnp::_::PointerReader::getList
            (&(this->declAnnotations).reader,(PointerReader *)&local_b8,INLINE_COMPOSITE,(word *)0x0
            );
  uVar2 = (decl->_reader).dataSize;
  if (uVar2 < 0x40) {
    this->startByte = 0;
    uVar10 = 0;
  }
  else {
    pvVar3 = (decl->_reader).data;
    this->startByte = *(uint *)((long)pvVar3 + 4);
    uVar10 = 0;
    if (0x5f < uVar2) {
      uVar10 = *(uint *)((long)pvVar3 + 8);
    }
  }
  this->endByte = uVar10;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = (SegmentBuilder *)0x0;
  (this->node)._builder.capTable = (CapTableBuilder *)0x0;
  (this->node)._builder.data = (void *)0x0;
  (this->node)._builder.pointers = (WirePointer *)0x0;
  (this->sourceInfo)._builder.segment = (SegmentBuilder *)0x0;
  (this->sourceInfo)._builder.capTable = (CapTableBuilder *)0x0;
  (this->sourceInfo)._builder.data = (void *)0x0;
  (this->sourceInfo)._builder.pointers = (WirePointer *)0x0;
  (this->field_21).fieldScope = fieldScope;
  uVar2 = (decl->_reader).dataSize;
  if ((0x1f < uVar2) && (pvVar3 = (decl->_reader).data, *(short *)((long)pvVar3 + 2) == 6)) {
    local_80 = (decl->_reader).segment;
    local_70 = (decl->_reader).capTable;
    local_78 = (decl->_reader).pointers;
    uVar1 = (decl->_reader).pointerCount;
    iVar12 = (decl->_reader).nestingLimit;
    if (uVar1 < 6) {
      local_58.nestingLimit = 0x7fffffff;
      local_58.capTable = (CapTableReader *)0x0;
      local_58.pointer = (WirePointer *)0x0;
      local_58.segment = (SegmentReader *)0x0;
    }
    else {
      local_58.pointer = local_78 + 5;
      local_58.capTable = local_70;
      local_58.segment = local_80;
      local_58.nestingLimit = iVar12;
    }
    capnp::_::PointerReader::getStruct(&local_b8,&local_58,(word *)0x0);
    (local_60->_reader).dataSize = local_b8.dataSize;
    (local_60->_reader).pointerCount = local_b8.pointerCount;
    *(undefined2 *)&(local_60->_reader).field_0x26 = local_b8._38_2_;
    *(ulong *)&(local_60->_reader).nestingLimit = CONCAT44(local_b8._44_4_,local_b8.nestingLimit);
    (local_60->_reader).data = local_b8.data;
    (local_60->_reader).pointers =
         (WirePointer *)CONCAT44(local_b8.pointers._4_4_,(int)local_b8.pointers);
    (local_60->_reader).segment = local_b8.segment;
    (local_60->_reader).capTable = local_b8.capTable;
    if ((0x6f < uVar2) && (*(short *)((long)pvVar3 + 0xc) == 1)) {
      this->hasDefaultValue = true;
      if (uVar1 < 7) {
        iVar12 = 0x7fffffff;
        local_58.capTable = (CapTableReader *)0x0;
        local_58.pointer = (WirePointer *)0x0;
        local_58.segment = (SegmentReader *)0x0;
      }
      else {
        local_58.pointer = local_78 + 6;
        local_58.capTable = local_70;
        local_58.segment = local_80;
      }
      local_58.nestingLimit = iVar12;
      capnp::_::PointerReader::getStruct(&local_b8,&local_58,(word *)0x0);
      (local_68->_reader).dataSize = local_b8.dataSize;
      (local_68->_reader).pointerCount = local_b8.pointerCount;
      *(undefined2 *)&(local_68->_reader).field_0x26 = local_b8._38_2_;
      *(ulong *)&(local_68->_reader).nestingLimit = CONCAT44(local_b8._44_4_,local_b8.nestingLimit);
      (local_68->_reader).data = local_b8.data;
      (local_68->_reader).pointers =
           (WirePointer *)CONCAT44(local_b8.pointers._4_4_,(int)local_b8.pointers);
      (local_68->_reader).segment = local_b8.segment;
      (local_68->_reader).capTable = local_b8.capTable;
    }
    if ((decl->_reader).pointerCount < 5) {
      local_b8.segment = (SegmentReader *)0x0;
      local_b8.capTable = (CapTableReader *)0x0;
      local_b8.data = (WirePointer *)0x0;
      local_b8.pointers._0_4_ = 0x7fffffff;
    }
    else {
      local_b8.data = (decl->_reader).pointers + 4;
      local_b8.pointers._0_4_ = (decl->_reader).nestingLimit;
      local_b8.segment = (decl->_reader).segment;
      local_b8.capTable = (decl->_reader).capTable;
    }
    PVar11 = capnp::_::PointerReader::getPointerType((PointerReader *)&local_b8);
    if (PVar11 != NULL_) {
      bVar13 = (decl->_reader).pointerCount < 5;
      local_b8.data = (decl->_reader).pointers + 4;
      if (bVar13) {
        local_b8.data = (WirePointer *)0x0;
      }
      local_b8.pointers._0_4_ = (decl->_reader).nestingLimit;
      if (bVar13) {
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        local_b8.pointers._0_4_ = 0x7fffffff;
      }
      else {
        uVar14 = *(undefined4 *)&(decl->_reader).segment;
        uVar15 = *(undefined4 *)((long)&(decl->_reader).segment + 4);
        uVar16 = *(undefined4 *)&(decl->_reader).capTable;
        uVar17 = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
      }
      local_b8.segment = (SegmentReader *)CONCAT44(uVar15,uVar14);
      local_b8.capTable = (CapTableReader *)CONCAT44(uVar17,uVar16);
      AVar18 = (ArrayPtr<const_char>)
               capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_b8,(void *)0x0,0);
      if ((this->docComment).ptr.isSet == true) {
        (this->docComment).ptr.isSet = false;
      }
      (this->docComment).ptr.field_1.value.super_StringPtr.content = AVar18;
      (this->docComment).ptr.isSet = true;
    }
    return;
  }
  local_58.segment = (SegmentReader *)0x0;
  local_b8.segment = (SegmentReader *)0x0;
  local_b8.capTable = (CapTableReader *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_58,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_58);
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(Declaration::FIELD),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      KJ_REQUIRE(decl.which() == Declaration::FIELD);
      auto fieldDecl = decl.getField();
      fieldType = fieldDecl.getType();
      if (fieldDecl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = fieldDecl.getDefaultValue().getValue();
      }
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }